

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O1

Read<double> __thiscall
Omega_h::Mesh::sync_subset_array<double>
          (Mesh *this,Int ent_dim,Read<double> *a_data,LOs *a2e,double default_val,Int width)

{
  int *piVar1;
  Alloc *pAVar2;
  bool bVar3;
  Int ent_dim_00;
  undefined8 extraout_RDX;
  void *pvVar4;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  undefined4 in_register_00000034;
  Mesh *this_00;
  undefined4 in_register_00000084;
  ulong *puVar5;
  Int in_R9D;
  Read<double> RVar6;
  Read<double> e_data;
  Alloc *local_c0;
  element_type *local_b8;
  Omega_h *local_b0;
  LOs local_a8;
  LOs local_98;
  Read<signed_char> local_88;
  Read<signed_char> local_78;
  Alloc *local_68;
  undefined8 local_60;
  Alloc *local_58;
  element_type *peStack_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Write<double> local_40;
  
  puVar5 = (ulong *)CONCAT44(in_register_00000084,width);
  this_00 = (Mesh *)CONCAT44(in_register_00000034,ent_dim);
  ent_dim_00 = (Int)a_data;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)default_val;
  bVar3 = could_be_shared(this_00,ent_dim_00);
  if (bVar3) {
    local_88.write_.shared_alloc_.alloc = (a2e->write_).shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.write_.shared_alloc_.alloc)->use_count =
             (local_88.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = (a2e->write_).shared_alloc_.direct_ptr;
    local_98.write_.shared_alloc_.alloc = (Alloc *)*puVar5;
    if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
        local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_98.write_.shared_alloc_.alloc =
             (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_98.write_.shared_alloc_.alloc)->use_count =
             (local_98.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_98.write_.shared_alloc_.direct_ptr = (void *)puVar5[1];
    check_dim2(this_00,ent_dim_00);
    local_b0 = (Omega_h *)&local_c0;
    map_onto<double>(local_b0,&local_88,&local_98,this_00->nents_[ent_dim_00],(double)local_48._M_pi
                     ,in_R9D);
    pAVar2 = local_98.write_.shared_alloc_.alloc;
    if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
        local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_88.write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    local_68 = local_c0;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68 = (Alloc *)(local_c0->size * 8 + 1);
      }
      else {
        local_c0->use_count = local_c0->use_count + 1;
      }
    }
    local_60 = local_b8;
    sync_array<double>((Mesh *)&local_58,ent_dim,(Read<double> *)((ulong)a_data & 0xffffffff),
                       (Int)&local_68);
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      piVar1 = &local_c0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c0);
        operator_delete(local_c0,0x48);
      }
    }
    pAVar2 = local_68;
    local_c0 = local_58;
    local_b8 = peStack_50;
    if ((((ulong)local_58 & 7) == 0 && local_58 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      local_58->use_count = local_58->use_count + -1;
      local_c0 = (Alloc *)(local_58->size * 8 + 1);
    }
    local_58 = (Alloc *)0x0;
    peStack_50 = (element_type *)0x0;
    if (((ulong)local_68 & 7) == 0 && local_68 != (Alloc *)0x0) {
      piVar1 = &local_68->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68);
        operator_delete(pAVar2,0x48);
      }
    }
    local_a8.write_.shared_alloc_.alloc = (Alloc *)*puVar5;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8.write_.shared_alloc_.alloc =
             (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_a8.write_.shared_alloc_.alloc)->use_count =
             (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_a8.write_.shared_alloc_.direct_ptr = (void *)puVar5[1];
    local_78.write_.shared_alloc_.alloc = local_c0;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc = (Alloc *)(local_c0->size * 8 + 1);
      }
      else {
        local_c0->use_count = local_c0->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = local_b8;
    unmap<double>((Omega_h *)&local_40,&local_a8,&local_78,in_R9D);
    Read<double>::Read((Read<signed_char> *)this,&local_40);
    pvVar4 = extraout_RDX_00;
    if (((ulong)local_40.shared_alloc_.alloc & 7) == 0 &&
        local_40.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_40.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_40.shared_alloc_.alloc);
        operator_delete(local_40.shared_alloc_.alloc,0x48);
        pvVar4 = extraout_RDX_01;
      }
    }
    pAVar2 = local_78.write_.shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_02;
      }
    }
    pAVar2 = local_a8.write_.shared_alloc_.alloc;
    if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_03;
      }
    }
    pAVar2 = local_c0;
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      piVar1 = &local_c0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c0);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_04;
      }
    }
  }
  else {
    pAVar2 = (a2e->write_).shared_alloc_.alloc;
    *(Alloc **)this = pAVar2;
    (this->comm_).super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(a2e->write_).shared_alloc_.direct_ptr;
    bVar3 = ((ulong)pAVar2 & 7) != 0;
    pvVar4 = (void *)CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar3 || pAVar2 == (Alloc *)0x0);
    if ((!bVar3 && pAVar2 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      pAVar2->use_count = pAVar2->use_count + -1;
      *(size_t *)this = pAVar2->size * 8 + 1;
    }
    (a2e->write_).shared_alloc_.alloc = (Alloc *)0x0;
    (a2e->write_).shared_alloc_.direct_ptr = (void *)0x0;
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar6.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_subset_array(
    Int ent_dim, Read<T> a_data, LOs a2e, T default_val, Int width) {
  if (!could_be_shared(ent_dim)) return a_data;
  auto e_data = map_onto(a_data, a2e, nents(ent_dim), default_val, width);
  e_data = sync_array(ent_dim, e_data, width);
  return unmap(a2e, e_data, width);
}